

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qsocks5socketengine_p.cpp
# Opt level: O3

void QSocks5SocketEngine::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long lVar1;
  undefined8 *puVar2;
  InterfaceType *pIVar3;
  
  if (_c == RegisterMethodArgumentMetaType) {
    if (_id == 2) {
      puVar2 = (undefined8 *)*_a;
      if (*_a[1] != 0) goto LAB_0023c167;
      pIVar3 = &QtPrivate::QMetaTypeInterfaceWrapper<QAbstractSocket::SocketError>::metaType;
    }
    else {
      if (_id != 9) {
        puVar2 = (undefined8 *)*_a;
LAB_0023c167:
        *puVar2 = 0;
        return;
      }
      puVar2 = (undefined8 *)*_a;
      if (*_a[1] != 0) goto LAB_0023c167;
      pIVar3 = &QtPrivate::QMetaTypeInterfaceWrapper<QAbstractSocket::SocketState>::metaType;
    }
    *puVar2 = pIVar3;
  }
  else if (_c == InvokeMetaMethod) {
    switch(_id) {
    case 0:
      QSocks5SocketEnginePrivate::_q_controlSocketConnected
                (*(QSocks5SocketEnginePrivate **)(_o + 8));
      return;
    case 1:
      QSocks5SocketEnginePrivate::_q_controlSocketReadNotification
                (*(QSocks5SocketEnginePrivate **)(_o + 8));
      return;
    case 2:
      QSocks5SocketEnginePrivate::_q_controlSocketErrorOccurred
                (*(QSocks5SocketEnginePrivate **)(_o + 8),*_a[1]);
      return;
    case 3:
      QSocks5SocketEnginePrivate::_q_udpSocketReadNotification
                (*(QSocks5SocketEnginePrivate **)(_o + 8));
      return;
    case 4:
      QSocks5SocketEnginePrivate::_q_controlSocketBytesWritten
                (*(QSocks5SocketEnginePrivate **)(_o + 8));
      return;
    case 5:
      QSocks5SocketEnginePrivate::_q_emitPendingReadNotification
                (*(QSocks5SocketEnginePrivate **)(_o + 8));
      return;
    case 6:
      lVar1 = *(long *)(_o + 8);
      *(undefined1 *)(lVar1 + 0x14b) = 0;
      if (*(char *)(lVar1 + 0xe9) == '\x01') {
        QAbstractSocketEngine::writeNotification(*(QAbstractSocketEngine **)(lVar1 + 8));
        return;
      }
      break;
    case 7:
      lVar1 = *(long *)(_o + 8);
      *(undefined1 *)(lVar1 + 0x14c) = 0;
      QAbstractSocketEngine::connectionNotification(*(QAbstractSocketEngine **)(lVar1 + 8));
      return;
    }
  }
  return;
}

Assistant:

void QSocks5SocketEngine::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QSocks5SocketEngine *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->d_func()->_q_controlSocketConnected(); break;
        case 1: _t->d_func()->_q_controlSocketReadNotification(); break;
        case 2: _t->d_func()->_q_controlSocketErrorOccurred((*reinterpret_cast< std::add_pointer_t<QAbstractSocket::SocketError>>(_a[1]))); break;
        case 3: _t->d_func()->_q_udpSocketReadNotification(); break;
        case 4: _t->d_func()->_q_controlSocketBytesWritten(); break;
        case 5: _t->d_func()->_q_emitPendingReadNotification(); break;
        case 6: _t->d_func()->_q_emitPendingWriteNotification(); break;
        case 7: _t->d_func()->_q_emitPendingConnectionNotification(); break;
        case 8: _t->d_func()->_q_controlSocketDisconnected(); break;
        case 9: _t->d_func()->_q_controlSocketStateChanged((*reinterpret_cast< std::add_pointer_t<QAbstractSocket::SocketState>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 2:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QAbstractSocket::SocketError >(); break;
            }
            break;
        case 9:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QAbstractSocket::SocketState >(); break;
            }
            break;
        }
    }
}